

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,string *value)

{
  char *pcVar1;
  undefined8 *in_RDI;
  char *unaff_retaddr;
  undefined8 *puVar2;
  uint length;
  
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xff00 | 4;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfeff | 0x100;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  puVar2 = in_RDI;
  std::__cxx11::string::c_str();
  length = (uint)((ulong)puVar2 >> 0x20);
  std::__cxx11::string::length();
  pcVar1 = duplicateStringValue(unaff_retaddr,length);
  *in_RDI = pcVar1;
  return;
}

Assistant:

Value::Value(const std::string& value)
    : type_(stringValue), allocated_(true)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(0), limit_(0) {
  value_.string_ =
      duplicateStringValue(value.c_str(), (unsigned int)value.length());
}